

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

void __thiscall
vera::dynamicCubemap
          (vera *this,
          function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
          *_renderFnc,vec3 _pos,int _viewSize)

{
  undefined8 uVar1;
  bool bVar2;
  undefined4 in_register_00000014;
  int iVar3;
  vec4 vp;
  GLint viewport [4];
  Camera cubemapCam;
  int local_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined4 local_328;
  undefined4 local_324;
  undefined4 local_320;
  undefined4 local_31c;
  vec3 local_318;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  float local_2c8;
  float fStack_2c4;
  undefined8 uStack_2c0;
  float local_2b8;
  float fStack_2b4;
  undefined8 uStack_2b0;
  vec3 local_2a0;
  Camera local_290;
  
  local_2a0.field_2 = _pos.field_2;
  local_2a0._0_8_ = _pos._0_8_;
  glGetIntegerv(0xba2,&local_328,CONCAT44(in_register_00000014,_viewSize));
  Camera::Camera(&local_290);
  Node::setPosition(&local_290.super_Node,&local_2a0);
  Camera::setFOV(&local_290,90.0);
  iVar3 = (int)_renderFnc;
  Camera::setViewport(&local_290,iVar3,iVar3);
  local_308 = (float)iVar3;
  local_33c = 0;
  local_2c8 = local_308 * 3.0;
  uStack_2c0 = 0;
  local_2e8 = ZEXT416((uint)local_308) << 0x20;
  local_2d8 = ZEXT416((uint)local_308);
  local_2b8 = local_308 + local_308;
  uStack_2f0 = 0;
  uStack_2b0 = 0;
  fStack_304 = local_308;
  fStack_300 = local_308;
  fStack_2fc = local_308;
  fStack_2b4 = local_308;
  local_2f8 = local_308;
  fStack_2f4 = local_2b8;
  fStack_2c4 = local_308;
  do {
    local_338 = local_2b8;
    fStack_334 = fStack_2b4;
    switch(local_33c) {
    case 0:
      break;
    case 1:
      local_338 = (float)local_2e8._0_4_;
      fStack_334 = (float)local_2e8._4_4_;
      break;
    case 2:
      local_338 = local_2f8;
      fStack_334 = fStack_2f4;
      break;
    case 3:
      local_338 = (float)local_2d8._0_4_;
      fStack_334 = (float)local_2d8._4_4_;
      break;
    case 4:
      local_338 = local_308;
      fStack_334 = fStack_304;
      break;
    case 5:
      local_338 = local_2c8;
      fStack_334 = fStack_2c4;
      break;
    default:
      local_338 = 0.0;
      fStack_334 = 0.0;
    }
    fStack_330 = local_308;
    fStack_32c = fStack_304;
    uVar1 = *(undefined8 *)((long)&cubemapDir + (long)local_33c * 0xc);
    local_318.field_2.z = (float)(&DAT_00431cc8)[(long)local_33c * 3] * -10.0;
    local_318.field_1.y = (float)((ulong)uVar1 >> 0x20) * -10.0;
    local_318.field_0.x = (float)uVar1 * -10.0;
    Node::lookAt(&local_290.super_Node,&local_318,(vec3)ZEXT812(0x3f80000000000000));
    glViewport((int)local_338,(int)fStack_334,(int)fStack_330,(int)fStack_32c);
    glEnable(0xc11);
    glScissor((int)local_338,(int)fStack_334,(int)fStack_330,(int)fStack_32c);
    if (*(long *)(this + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    (**(code **)(this + 0x18))(this,&local_290,&local_338,&local_33c);
    iVar3 = local_33c + 1;
    bVar2 = 4 < local_33c;
    local_33c = iVar3;
    if (bVar2) {
      glViewport(local_328,local_324,local_320,local_31c);
      glDisable(0xc11);
      glScissor(local_328,local_324,local_320,local_31c);
      Camera::~Camera(&local_290);
      return;
    }
  } while( true );
}

Assistant:

void dynamicCubemap(std::function<void(Camera&, glm::vec4&, int&)> _renderFnc, glm::vec3 _pos, int _viewSize) {

    // save the viewport for the total quilt
    GLint viewport[4];
    glGetIntegerv(GL_VIEWPORT, viewport);

    Camera  cubemapCam;
    cubemapCam.setPosition(_pos);
    cubemapCam.setFOV(90.0);
    cubemapCam.setViewport(_viewSize, _viewSize);

    // render views and copy each view to the quilt
    for (int _side = 0; _side < 6; _side++) {
        glm::vec4 vp = getFaceViewport(_viewSize, _side);
        cubemapCam.lookAt( CubemapFace<float>::getFaceDirection(_side) * -10.0f );

        glViewport(vp.x, vp.y, vp.z, vp.w);

        glEnable(GL_SCISSOR_TEST);
        glScissor(vp.x, vp.y, vp.z, vp.w);

        _renderFnc(cubemapCam, vp, _side);
    }

    // reset viewport
    glViewport(viewport[0], viewport[1], viewport[2], viewport[3]);

    // // restore scissor
    glDisable(GL_SCISSOR_TEST);
    glScissor(viewport[0], viewport[1], viewport[2], viewport[3]);


}